

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QString * __thiscall QAccessibleTabBar::text(QAccessibleTabBar *this,Text t)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTabBar *this_00;
  int in_EDX;
  undefined8 in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int idx;
  QTabBar *tBar;
  QString *str;
  QTabBar *in_stack_ffffffffffffff68;
  QString *pQVar4;
  int index;
  uint in_stack_ffffffffffffff88;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff8c;
  QString *text;
  
  index = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    pQVar4 = in_RDI;
    text = in_RDI;
    tabBar((QAccessibleTabBar *)0x7d4886);
    iVar3 = QTabBar::currentIndex(in_stack_ffffffffffffff68);
    uVar5 = in_stack_ffffffffffffff88 & 0xffffff;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QTabBar::accessibleTabName
              ((QTabBar *)(CONCAT44(iVar3,in_stack_ffffffffffffff88) & 0xffffffff00ffffff),index);
    bVar2 = QString::isEmpty((QString *)0x7d48db);
    if (bVar2) {
      QTabBar::tabText((QTabBar *)CONCAT44(iVar3,uVar5),index);
      qt_accStripAmp(text);
      QString::operator=(in_RDI,(QString *)in_stack_ffffffffffffff68);
      QString::~QString((QString *)0x7d491c);
      QString::~QString((QString *)0x7d4926);
    }
  }
  else if (in_EDX == 4) {
    this_00 = tabBar((QAccessibleTabBar *)0x7d494f);
    tabBar((QAccessibleTabBar *)0x7d495d);
    QTabBar::currentIndex(this_00);
    QTabBar::tabText((QTabBar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),index)
    ;
    qt_accHotKey(in_RDI);
    QString::~QString((QString *)0x7d498e);
    pQVar4 = in_RDI;
  }
  else {
    QString::QString((QString *)0x7d499c);
    pQVar4 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleTabBar::text(QAccessible::Text t) const
{
    if (t == QAccessible::Name) {
        const QTabBar *tBar = tabBar();
        int idx = tBar->currentIndex();
        QString str = tBar->accessibleTabName(idx);
        if (str.isEmpty())
            str = qt_accStripAmp(tBar->tabText(idx));
        return str;
    } else if (t == QAccessible::Accelerator) {
        return qt_accHotKey(tabBar()->tabText(tabBar()->currentIndex()));
    }
    return QString();
}